

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform,char *name,vec2 v)

{
  int iVar1;
  int local_2c;
  golf_shader_uniform_member_t *pgStack_28;
  int i;
  golf_shader_uniform_member_t *member;
  char *name_local;
  golf_shader_uniform_t *uniform_local;
  vec2 v_local;
  
  pgStack_28 = (golf_shader_uniform_member_t *)0x0;
  for (local_2c = 0; local_2c < (uniform->members).length; local_2c = local_2c + 1) {
    iVar1 = strcmp((uniform->members).data[local_2c].name,name);
    if ((iVar1 == 0) && ((uniform->members).data[local_2c].size == 8)) {
      pgStack_28 = (uniform->members).data + local_2c;
    }
  }
  if (pgStack_28 == (golf_shader_uniform_member_t *)0x0) {
    golf_log_warning("Unable to find vec2 member: %s",name);
  }
  else {
    *(vec2 *)(uniform->data + pgStack_28->offset) = v;
  }
  return;
}

Assistant:

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform, const char *name, vec2 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 8) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec2 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 8);
}